

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall
Fl_Text_Display::update_line_starts
          (Fl_Text_Display *this,int pos,int charsInserted,int charsDeleted,int linesInserted,
          int linesDeleted,int *scrolled)

{
  int endLine;
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int lineOfEnd;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar1 = this->mLineStarts;
  endLine = this->mNVisibleLines;
  lVar5 = (long)endLine;
  iVar4 = charsInserted - charsDeleted;
  uVar6 = linesInserted - linesDeleted;
  if (charsDeleted + pos < this->mFirstChar) {
    this->mTopLineNum = this->mTopLineNum + uVar6;
    if (0 < endLine) {
      lVar3 = 0;
      do {
        if (piVar1[lVar3] == -1) break;
        piVar1[lVar3] = piVar1[lVar3] + iVar4;
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
    }
    this->mFirstChar = this->mFirstChar + iVar4;
    this->mLastChar = this->mLastChar + iVar4;
    iVar4 = 0;
    goto LAB_001d454d;
  }
  if (this->mFirstChar <= pos) {
    if (this->mLastChar < pos) {
      iVar4 = 0;
      if ((0 < endLine) && (piVar1[lVar5 + -1] == -1)) {
        position_to_line(this,pos,&local_3c);
        calc_line_starts(this,local_3c,linesInserted + local_3c);
        calc_last_char(this);
        iVar4 = 0;
      }
    }
    else {
      local_34 = linesInserted;
      position_to_line(this,pos,&local_3c);
      if (local_34 == linesDeleted) {
        lVar5 = (long)local_3c;
        if (local_3c + 1 < endLine) {
          do {
            if (piVar1[lVar5 + 1] == -1) break;
            piVar1[lVar5 + 1] = piVar1[lVar5 + 1] + iVar4;
            lVar5 = lVar5 + 1;
          } while (endLine + -1 != (int)lVar5);
        }
      }
      else if ((int)uVar6 < 1) {
        iVar2 = -1;
        if (-1 < local_3c) {
          iVar2 = local_3c;
        }
        if (iVar2 + 1 < (int)(endLine + uVar6)) {
          iVar2 = -1;
          if (-1 < local_3c) {
            iVar2 = local_3c;
          }
          lVar5 = (long)iVar2 + 1;
          do {
            iVar2 = iVar4;
            if (piVar1[(linesDeleted + lVar5) - (long)local_34] == -1) {
              iVar2 = 0;
            }
            piVar1[lVar5] = iVar2 + piVar1[(linesDeleted + lVar5) - (long)local_34];
            lVar5 = lVar5 + 1;
          } while (lVar5 < (int)(endLine + uVar6));
        }
      }
      else if ((int)(local_3c + uVar6 + 1) < endLine) {
        do {
          iVar2 = iVar4;
          if (piVar1[(lVar5 + -1) - (ulong)uVar6] == -1) {
            iVar2 = 0;
          }
          piVar1[lVar5 + -1] = iVar2 + piVar1[(lVar5 + -1) - (ulong)uVar6];
          lVar5 = lVar5 + -1;
        } while ((int)(local_3c + uVar6 + 1) < lVar5);
      }
      if (-1 < local_34) {
        calc_line_starts(this,local_3c + 1,local_34 + local_3c);
      }
      if ((int)uVar6 < 0) {
        calc_line_starts(this,uVar6 + endLine,endLine);
      }
      calc_last_char(this);
      iVar4 = 0;
    }
    goto LAB_001d454d;
  }
  iVar2 = position_to_line(this,charsDeleted + pos,&local_38);
  if (iVar2 == 0) {
LAB_001d43ab:
    if ((int)(uVar6 + this->mNBufferLines) < this->mTopLineNum) {
      this->mTopLineNum = 1;
      iVar4 = 0;
    }
    else {
      iVar4 = skip_lines(this,0,this->mTopLineNum + -1,true);
    }
  }
  else {
    lVar5 = (long)local_38;
    local_38 = local_38 + 1;
    if ((endLine <= local_38) || (piVar1[lVar5 + 1] == -1)) goto LAB_001d43ab;
    iVar7 = uVar6 + this->mTopLineNum;
    iVar2 = 1;
    if (1 < iVar7) {
      iVar2 = iVar7;
    }
    this->mTopLineNum = iVar2;
    iVar4 = rewind_lines(this,iVar4 + piVar1[lVar5 + 1],local_38);
  }
  this->mFirstChar = iVar4;
  calc_line_starts(this,0,endLine + -1);
  calc_last_char(this);
  iVar4 = 1;
LAB_001d454d:
  *scrolled = iVar4;
  return;
}

Assistant:

void Fl_Text_Display::update_line_starts(int pos, int charsInserted,
                                         int charsDeleted, int linesInserted,
                                         int linesDeleted, int *scrolled ) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int *lineStarts = mLineStarts;
  int i, lineOfPos, lineOfEnd, nVisLines = mNVisibleLines;
  int charDelta = charsInserted - charsDeleted;
  int lineDelta = linesInserted - linesDeleted;

  /* If all of the changes were before the displayed text, the display
   doesn't change, just update the top line num and offset the line
   start entries and first and last characters */
  if ( pos + charsDeleted < mFirstChar ) {
    mTopLineNum += lineDelta;
    for ( i = 0; i < nVisLines && lineStarts[i] != -1; i++ )
      lineStarts[ i ] += charDelta;
    mFirstChar += charDelta;
    mLastChar += charDelta;
    *scrolled = 0;
    return;
  }

  /* The change began before the beginning of the displayed text, but
   part or all of the displayed text was deleted */
  if ( pos < mFirstChar ) {
    /* If some text remains in the window, anchor on that  */
    if ( position_to_line( pos + charsDeleted, &lineOfEnd ) &&
        ++lineOfEnd < nVisLines && lineStarts[ lineOfEnd ] != -1 ) {
      mTopLineNum = max( 1, mTopLineNum + lineDelta );
      mFirstChar = rewind_lines(lineStarts[ lineOfEnd ] + charDelta, lineOfEnd );
      /* Otherwise anchor on original line number and recount everything */
    } else {
      if ( mTopLineNum > mNBufferLines + lineDelta ) {
        mTopLineNum = 1;
        mFirstChar = 0;
      } else
        mFirstChar = skip_lines( 0, mTopLineNum - 1, true );
    }
    calc_line_starts( 0, nVisLines - 1 );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 1;
    return;
  }

  /* If the change was in the middle of the displayed text (it usually is),
   salvage as much of the line starts array as possible by moving and
   offsetting the entries after the changed area, and re-counting the
   added lines or the lines beyond the salvaged part of the line starts
   array */
  if ( pos <= mLastChar ) {
    /* find line on which the change began */
    position_to_line( pos, &lineOfPos );
    /* salvage line starts after the changed area */
    if ( lineDelta == 0 ) {
      for ( i = lineOfPos + 1; i < nVisLines && lineStarts[ i ] != -1; i++ )
        lineStarts[ i ] += charDelta;
    } else if ( lineDelta > 0 ) {
      for ( i = nVisLines - 1; i >= lineOfPos + lineDelta + 1; i-- )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    } else /* (lineDelta < 0) */ {
      for ( i = max( 0, lineOfPos + 1 ); i < nVisLines + lineDelta; i++ )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    }
    /* fill in the missing line starts */
    if ( linesInserted >= 0 )
      calc_line_starts( lineOfPos + 1, lineOfPos + linesInserted );
    if ( lineDelta < 0 )
      calc_line_starts( nVisLines + lineDelta, nVisLines );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was past the end of the displayed text, but displayable by virtue
   of being an insert at the end of the buffer into visible blank lines */
  if ( empty_vlines() ) {
    position_to_line( pos, &lineOfPos );
    calc_line_starts( lineOfPos, lineOfPos + linesInserted );
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was beyond the end of the buffer and not visible, do nothing */
  *scrolled = 0;
}